

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

bool bssl::add_session_locked(SSL_CTX *ctx,UniquePtr<SSL_SESSION> *session)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  size_t sVar4;
  pointer local_30;
  SSL_SESSION *old_session;
  SSL_SESSION *new_session;
  UniquePtr<SSL_SESSION> *session_local;
  SSL_CTX *ctx_local;
  
  new_session = (SSL_SESSION *)session;
  session_local = (UniquePtr<SSL_SESSION> *)ctx;
  old_session = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(session);
  iVar2 = lh_SSL_SESSION_insert
                    ((lhash_st_SSL_SESSION *)
                     session_local[0xe]._M_t.
                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,&local_30,
                     old_session);
  if (iVar2 == 0) {
    ctx_local._7_1_ = false;
  }
  else {
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::release(session);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::reset(session,local_30);
    if (local_30 != (SSL_SESSION *)0x0) {
      if (local_30 == old_session) {
        return false;
      }
      SSL_SESSION_list_remove((SSL_CTX *)session_local,local_30);
    }
    SSL_SESSION_list_add((SSL_CTX *)session_local,old_session);
    uVar3 = SSL_CTX_sess_get_cache_size((SSL_CTX *)session_local);
    if (uVar3 != 0) {
      do {
        sVar4 = lh_SSL_SESSION_num_items
                          ((lhash_st_SSL_SESSION *)
                           session_local[0xe]._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
        uVar3 = SSL_CTX_sess_get_cache_size((SSL_CTX *)session_local);
        if (sVar4 <= uVar3) break;
        bVar1 = remove_session((SSL_CTX *)session_local,
                               session_local[0x11]._M_t.
                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,false);
      } while (bVar1);
    }
    ctx_local._7_1_ = true;
  }
  return ctx_local._7_1_;
}

Assistant:

static bool add_session_locked(SSL_CTX *ctx, UniquePtr<SSL_SESSION> session) {
  SSL_SESSION *new_session = session.get();
  SSL_SESSION *old_session;
  if (!lh_SSL_SESSION_insert(ctx->sessions, &old_session, new_session)) {
    return false;
  }
  // |ctx->sessions| took ownership of |new_session| and gave us back a
  // reference to |old_session|. (|old_session| may be the same as
  // |new_session|, in which case we traded identical references with
  // |ctx->sessions|.)
  session.release();
  session.reset(old_session);

  if (old_session != nullptr) {
    if (old_session == new_session) {
      // |session| was already in the cache. There are no linked list pointers
      // to update.
      return false;
    }

    // There was a session ID collision. |old_session| was replaced with
    // |session| in the hash table, so |old_session| must be removed from the
    // linked list to match.
    SSL_SESSION_list_remove(ctx, old_session);
  }

  // This does not increment the reference count. Although |session| is inserted
  // into two structures (a doubly-linked list and the hash table), |ctx| only
  // takes one reference.
  SSL_SESSION_list_add(ctx, new_session);

  // Enforce any cache size limits.
  if (SSL_CTX_sess_get_cache_size(ctx) > 0) {
    while (lh_SSL_SESSION_num_items(ctx->sessions) >
           SSL_CTX_sess_get_cache_size(ctx)) {
      if (!remove_session(ctx, ctx->session_cache_tail,
                          /*lock=*/false)) {
        break;
      }
    }
  }

  return true;
}